

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::SimpleGraphicsPipelineBuilder::bindShaderStage
          (SimpleGraphicsPipelineBuilder *this,VkShaderStageFlagBits stage,char *sourceName,
          char *entryName)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ProgramCollection<vk::ProgramBinary> *pPVar4;
  deUint32 *pdVar5;
  DeviceInterface *vk;
  VkDevice device;
  ProgramBinary *pPVar6;
  VkShaderModuleCreateInfo moduleCreateInfo;
  undefined1 local_a0 [32];
  deUint32 *local_80;
  deUint64 local_78;
  DeviceInterface *pDStack_70;
  VkDevice local_68;
  VkAllocationCallbacks *pVStack_60;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_58;
  
  vk = Context::getDeviceInterface(this->m_context);
  device = Context::getDevice(this->m_context);
  pPVar4 = this->m_context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,sourceName,(allocator<char> *)&local_78);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,(string *)local_a0);
  pdVar5 = (deUint32 *)
           (pPVar6->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_80 = (deUint32 *)0x0;
  if (pdVar5 != (deUint32 *)
                (pPVar6->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_80 = pdVar5;
  }
  std::__cxx11::string::~string((string *)local_a0);
  pPVar4 = this->m_context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,sourceName,(allocator<char> *)&local_78);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,(string *)local_a0);
  iVar1 = *(int *)&(pPVar6->m_binary).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(pPVar6->m_binary).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  std::__cxx11::string::~string((string *)local_a0);
  local_a0._0_4_ = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  local_a0._8_8_ = (void *)0x0;
  local_a0._16_4_ = 0;
  local_a0._24_8_ = (ulong)(uint)(iVar1 - iVar2);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_58,vk,device,
             (VkShaderModuleCreateInfo *)local_a0,(VkAllocationCallbacks *)0x0);
  local_68 = local_58.m_data.deleter.m_device;
  pVStack_60 = local_58.m_data.deleter.m_allocator;
  local_78 = local_58.m_data.object.m_internal;
  pDStack_70 = local_58.m_data.deleter.m_deviceIface;
  local_58.m_data.object.m_internal = 0;
  local_58.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_58.m_data.deleter.m_device = (VkDevice)0x0;
  local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  uVar3 = this->m_shaderStageCount;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
            (&this->m_shaderModules[uVar3].super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  this->m_shaderModules[uVar3].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = local_68;
  this->m_shaderModules[uVar3].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = pVStack_60;
  this->m_shaderModules[uVar3].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = local_78;
  this->m_shaderModules[uVar3].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = pDStack_70;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_58);
  uVar3 = this->m_shaderStageCount;
  this->m_shaderStageInfo[uVar3].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  this->m_shaderStageInfo[uVar3].pNext = (void *)0x0;
  this->m_shaderStageInfo[uVar3].flags = 0;
  this->m_shaderStageInfo[uVar3].stage = stage;
  this->m_shaderStageInfo[uVar3].module.m_internal =
       this->m_shaderModules[uVar3].super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  this->m_shaderStageInfo[uVar3].pName = "main";
  this->m_shaderStageInfo[uVar3].pSpecializationInfo = (VkSpecializationInfo *)0x0;
  this->m_shaderStageCount = uVar3 + 1;
  return;
}

Assistant:

void SimpleGraphicsPipelineBuilder::bindShaderStage(VkShaderStageFlagBits stage,
													const char*           source_name,
													const char*           entry_name)
{
	const DeviceInterface&  vk        = m_context.getDeviceInterface();
	const VkDevice          vkDevice  = m_context.getDevice();

	// Create shader module
	deUint32*               pCode     = (deUint32*)m_context.getBinaryCollection().get(source_name).getBinary();
	deUint32                codeSize  = (deUint32)m_context.getBinaryCollection().get(source_name).getSize();

	const VkShaderModuleCreateInfo moduleCreateInfo =
	{
		VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO,                // VkStructureType             sType;
		DE_NULL,                                                    // const void*                 pNext;
		0u,                                                         // VkShaderModuleCreateFlags   flags;
		codeSize,                                                   // deUintptr                   codeSize;
		pCode,                                                      // const deUint32*             pCode;
	};

	m_shaderModules[m_shaderStageCount] = createShaderModule(vk, vkDevice, &moduleCreateInfo);

	// Prepare shader stage info
	m_shaderStageInfo[m_shaderStageCount].sType               = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
	m_shaderStageInfo[m_shaderStageCount].pNext               = DE_NULL;
	m_shaderStageInfo[m_shaderStageCount].flags               = 0u;
	m_shaderStageInfo[m_shaderStageCount].stage               = stage;
	m_shaderStageInfo[m_shaderStageCount].module              = *m_shaderModules[m_shaderStageCount];
	m_shaderStageInfo[m_shaderStageCount].pName               = entry_name;
	m_shaderStageInfo[m_shaderStageCount].pSpecializationInfo = DE_NULL;

	m_shaderStageCount++;
}